

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ReplicatedAssignmentPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ReplicatedAssignmentPatternSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_3,Token *args_4,Token *args_5)

{
  Token innerOpenBrace;
  Token openBrace;
  Token innerCloseBrace;
  Token closeBrace;
  ReplicatedAssignmentPatternSyntax *pRVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_RDI;
  Info *in_R9;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pRVar1 = (ReplicatedAssignmentPatternSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  openBrace.info = in_R9;
  openBrace._0_8_ = in_RSI->location;
  innerOpenBrace.info = (Info *)in_RSI->rawTextPtr;
  innerOpenBrace._0_8_ = *(undefined8 *)&(in_RCX->super_SyntaxListBase).super_SyntaxNode;
  innerCloseBrace.info = in_RSI;
  innerCloseBrace.kind = (short)in_RDX;
  innerCloseBrace._2_1_ = (char)((ulong)in_RDX >> 0x10);
  innerCloseBrace.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  innerCloseBrace.rawLen = (int)((ulong)in_RDX >> 0x20);
  closeBrace.info = unaff_retaddr;
  closeBrace.kind = (short)in_RDI;
  closeBrace._2_1_ = (char)((ulong)in_RDI >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  closeBrace.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ReplicatedAssignmentPatternSyntax::ReplicatedAssignmentPatternSyntax
            ((ReplicatedAssignmentPatternSyntax *)
             (in_RCX->super_SyntaxListBase)._vptr_SyntaxListBase,openBrace,
             (ExpressionSyntax *)in_R9->location,innerOpenBrace,in_RCX,innerCloseBrace,closeBrace);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }